

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForMultipleOutputParameters_Test::testBody
          (TEST_MockExpectedCall_toStringForMultipleOutputParameters_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_108 [64];
  SimpleString local_c8;
  undefined1 local_b8 [8];
  MockCheckedExpectedCall expectedCall;
  uchar buffer_value [3];
  TEST_MockExpectedCall_toStringForMultipleOutputParameters_Test *this_local;
  
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b8,1);
  SimpleString::SimpleString(&local_c8,"name");
  MockCheckedExpectedCall::withName((MockCheckedExpectedCall *)local_b8,&local_c8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::SimpleString((SimpleString *)(local_108 + 0x20),"buffer1");
  MockCheckedExpectedCall::withOutputParameterReturning
            ((MockCheckedExpectedCall *)local_b8,(SimpleString *)(local_108 + 0x20),
             &expectedCall.field_0x9d,3);
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x20));
  SimpleString::SimpleString((SimpleString *)(local_108 + 0x10),"buffer2");
  MockCheckedExpectedCall::withOutputParameterReturning
            ((MockCheckedExpectedCall *)local_b8,(SimpleString *)(local_108 + 0x10),
             &expectedCall.field_0x9d,3);
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x10));
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b8,1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_108);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_108);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "name -> const void* buffer1: <output>, const void* buffer2: <output> (expected 1 call, called 1 time)"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x267,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_108);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b8);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForMultipleOutputParameters)
{
    unsigned char buffer_value[3];

    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withOutputParameterReturning("buffer1", buffer_value, sizeof(buffer_value));
    expectedCall.withOutputParameterReturning("buffer2", buffer_value, sizeof(buffer_value));
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const void* buffer1: <output>, const void* buffer2: <output> (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}